

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_codim_mesh_data_set.h
# Opt level: O3

void __thiscall
lf::mesh::utils::AllCodimMeshDataSet<bool>::AllCodimMeshDataSet<bool,void>
          (AllCodimMeshDataSet<bool> *this,shared_ptr<const_lf::mesh::Mesh> *mesh,bool init_value)

{
  vector<boost::container::vector<bool,_void,_void>,_void,_void> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  dim_t dVar3;
  uint uVar4;
  ulong initial_capacity;
  vector_alloc_holder<boost::container::new_allocator<bool>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  *this_01;
  ulong uVar5;
  vector_alloc_holder<boost::container::new_allocator<bool>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  local_48;
  
  (this->super_MeshDataSet<bool>)._vptr_MeshDataSet = (_func_int **)&PTR_operator___0036f120;
  dVar3 = (**((mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Mesh)();
  this->dim_mesh_ = dVar3;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = &this->data_;
  uVar5 = (ulong)(this->dim_mesh_ + 1);
  (this->data_).m_holder.m_start = (pointer)0x0;
  (this->data_).m_holder.m_size = uVar5;
  (this->data_).m_holder.m_capacity = 0;
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<boost::container::vector<bool,_void,_void>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::do_initial_capacity<unsigned_long>(&this_00->m_holder,uVar5);
  if (uVar5 != 0) {
    memset((this_00->m_holder).m_start,0,uVar5 * 0x18);
  }
  uVar5 = 0;
  do {
    peVar2 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar4 = (*peVar2->_vptr_Mesh[3])(peVar2,uVar5);
    initial_capacity = (ulong)uVar4;
    local_48.m_start = (pointer)0x0;
    local_48.m_capacity = 0;
    local_48.m_size = initial_capacity;
    boost::container::
    vector_alloc_holder<boost::container::new_allocator<bool>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
    ::do_initial_capacity<unsigned_long>(&local_48,initial_capacity);
    if (uVar4 != 0) {
      memset(local_48.m_start,(uint)init_value,initial_capacity);
    }
    if ((this->data_).m_holder.m_size <= uVar5) {
      boost::assertion_failed
                ("this->m_holder.m_size > n",
                 "reference boost::container::vector<boost::container::vector<bool>>::operator[](size_type) [T = boost::container::vector<bool>, A = void, Options = void]"
                 ,
                 "/root/.hunter/_Base/7456937/c3d17be/2b93a9d/Install/include/boost/container/vector.hpp"
                 ,0x6cb);
    }
    this_01 = &(this_00->m_holder).m_start[uVar5].m_holder;
    if (&local_48 != this_01) {
      boost::container::vector<bool,_void,_void>::priv_move_assign<void>
                ((vector<bool,_void,_void> *)this_01,(vector<bool,_void,_void> *)&local_48,
                 (type *)0x0);
    }
    if (local_48.m_capacity != 0) {
      operator_delete(local_48.m_start,local_48.m_capacity);
    }
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 <= this->dim_mesh_);
  return;
}

Assistant:

AllCodimMeshDataSet(const std::shared_ptr<const lf::mesh::Mesh>& mesh,
                      X init_value)
      : MeshDataSet<T>(),
        dim_mesh_(mesh->DimMesh()),
        mesh_(mesh),
        data_(dim_mesh_ + 1) {
    for (dim_t codim = 0; codim <= dim_mesh_; ++codim) {
      data_[codim] =
          boost::container::vector<T>(mesh_->NumEntities(codim), init_value);
    }
  }